

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

function<void_(void_*,_void_*,_int_*)> *
mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*)>_>::get(MPI_Datatype *dt,int *k)

{
  bool bVar1;
  mutex *__m;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar2;
  mapped_type *pmVar3;
  out_of_range *poVar4;
  int local_54;
  function<void_(void_*,_void_*,_int_*)> *pfStack_50;
  int flag;
  function<void_(void_*,_void_*,_int_*)> *result;
  iterator iStack_40;
  int key;
  _Self local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  int *k_local;
  MPI_Datatype *dt_local;
  
  lock._M_device = (mutex_type *)k;
  __m = mut();
  std::lock_guard<std::mutex>::lock_guard(&local_20,__m);
  pmVar2 = keymap();
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                 (pmVar2,(key_type *)lock._M_device);
  pmVar2 = keymap();
  iStack_40 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                        (pmVar2);
  bVar1 = std::operator==(&local_28,&stack0xffffffffffffffc0);
  if (bVar1) {
    poVar4 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar4,"Key not mapped.");
    __cxa_throw(poVar4,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  pmVar2 = keymap();
  pmVar3 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](pmVar2,(key_type *)lock._M_device);
  result._4_4_ = *pmVar3;
  MPI_Type_get_attr(*dt,result._4_4_,&stack0xffffffffffffffb0,&local_54);
  if (local_54 == 0) {
    poVar4 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(poVar4,"Key not mapped.");
    __cxa_throw(poVar4,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return pfStack_50;
}

Assistant:

static T& get(const MPI_Datatype& dt, const K& k) {
        std::lock_guard<std::mutex> lock(mut());
        if (keymap().find(k) == keymap().end()) {
            throw std::out_of_range("Key not mapped.");
        }
        int key = keymap()[k];
        T* result;
        int flag;
        MPI_Type_get_attr(dt, key, &result, &flag);
        if (!flag) {
            throw std::out_of_range("Key not mapped.");
        }
        return *result;
    }